

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_dense.hpp
# Opt level: O3

void __thiscall
Disa::Matrix_Dense<double,_0UL,_0UL>::Matrix_Dense
          (Matrix_Dense<double,_0UL,_0UL> *this,
          initializer_list<Disa::Vector_Dense<double,_0UL>_> *list)

{
  ostream *poVar1;
  iterator location;
  vector<double,_std::allocator<double>_> *this_00;
  long lVar2;
  vector<double,_std::allocator<double>_> *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined **local_30;
  
  (this->
  super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>).
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->
  super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>).
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->
  super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>).
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  resize(&this->
          super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
         ,list->_M_len);
  if (list->_M_len != 0) {
    __x = &list->_M_array->super_vector<double,_std::allocator<double>_>;
    this_00 = &((this->
                super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                ).
                super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
               super_vector<double,_std::allocator<double>_>;
    lVar2 = list->_M_len * 0x18;
    do {
      location = list->_M_array;
      if ((long)(__x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(__x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start !=
          (long)(location->super_vector<double,_std::allocator<double>_>).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(location->super_vector<double,_std::allocator<double>_>).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
        local_30 = &PTR_s__workspace_llm4binary_github_lic_00156ac0;
        console_format_abi_cxx11_
                  (&local_50,(Disa *)0x0,(Log_Level)&local_30,(source_location *)location);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_50._M_dataplus._M_p,
                            local_50._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"List dimension varies.",0x16);
        std::endl<char,std::char_traits<char>>(poVar1);
        std::__cxx11::string::~string((string *)&local_50);
        exit(1);
      }
      std::vector<double,_std::allocator<double>_>::operator=(this_00,__x);
      this_00 = this_00 + 1;
      __x = __x + 1;
      lVar2 = lVar2 + -0x18;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

Matrix_Dense(const std::initializer_list<Vector_Dense<_type, 0>>& list) {
    resize(list.size());
    auto iter = this->begin();
    FOR_EACH(item, list) {
      ASSERT_DEBUG(item.size() == list.begin()->size(), "List dimension varies.");
      *iter++ = item;
    }
  }